

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O0

int Csw_TableCountCuts(Csw_Man_t *p)

{
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Csw_Cut_t *pEnt;
  Csw_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
    for (_Counter = p->pTable[local_1c]; _Counter != (Csw_Cut_t *)0x0; _Counter = _Counter->pNext) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Csw_TableCountCuts( Csw_Man_t * p )
{
    Csw_Cut_t * pEnt;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEnt = p->pTable[i]; pEnt; pEnt = pEnt->pNext )
            Counter++;
    return Counter;
}